

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::~App(App *this)

{
  this->_vptr_App = (_func_int **)&PTR__App_004bc318;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->aliases_);
  ::std::__cxx11::string::~string((string *)&this->group_);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::~vector
            (&this->subcommands_);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&(this->need_options_)._M_t);
  std::
  _Rb_tree<CLI::App_*,_CLI::App_*,_std::_Identity<CLI::App_*>,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>
  ::~_Rb_tree(&(this->need_subcommands_)._M_t);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&(this->exclude_options_)._M_t);
  std::
  _Rb_tree<CLI::App_*,_CLI::App_*,_std::_Identity<CLI::App_*>,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>
  ::~_Rb_tree(&(this->exclude_subcommands_)._M_t);
  std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base
            (&(this->parsed_subcommands_).
              super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>);
  std::_Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>::~_Vector_base
            (&(this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>
            );
  std::
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->missing_);
  ::std::_Function_base::~_Function_base((_Function_base *)&this->failure_message_);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&this->footer_callback_);
  ::std::__cxx11::string::~string((string *)&this->footer_);
  ::std::_Function_base::~_Function_base((_Function_base *)&this->usage_callback_);
  ::std::__cxx11::string::~string((string *)&this->usage_);
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::~vector(&this->options_);
  ::std::__cxx11::string::~string((string *)&this->option_defaults_);
  ::std::_Function_base::~_Function_base((_Function_base *)&this->final_callback_);
  ::std::_Function_base::~_Function_base((_Function_base *)&this->parse_complete_callback_);
  ::std::_Function_base::~_Function_base((_Function_base *)&this->pre_parse_callback_);
  ::std::__cxx11::string::~string((string *)&this->description_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~App() = default;